

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::ShiftRight_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  int32 iVar1;
  uint32 uVar2;
  
  iVar1 = JavascriptConversion::ToInt32(aLeft,scriptContext);
  uVar2 = JavascriptConversion::ToUInt32(aRight,scriptContext);
  return (Var)((ulong)(uint)(iVar1 >> ((byte)uVar2 & 0x1f)) | 0x1000000000000);
}

Assistant:

Var JavascriptMath::ShiftRight_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_ShiftRight_Full);
            int32 nValue    = JavascriptConversion::ToInt32(aLeft, scriptContext);
            uint32 nShift   = JavascriptConversion::ToUInt32(aRight, scriptContext);

            int32 nResult   = nValue >> (nShift & 0x1F);

            return JavascriptNumber::ToVar(nResult,scriptContext);
            JIT_HELPER_END(Op_ShiftRight_Full);
        }